

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
          (string *__return_storage_ptr__,void *this,char *globalLayouts)

{
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,(char *)this,&local_51);
  std::operator+(&local_50,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",&local_30);
  std::operator+(__return_storage_ptr__,&local_50,
                 ";\nvoid main (void)\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.y * gl_in[2].gl_Position\n\t            + gl_TessCoord.z * gl_in[3].gl_Position;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string TessProgramQueryCase::getTessEvalSource (const char* globalLayouts) const
{
	return	"${GLSL_VERSION_DECL}\n"
			"${TESSELLATION_SHADER_REQUIRE}\n"
			+ std::string(globalLayouts) + ";\n"
			"void main (void)\n"
			"{\n"
			"	gl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n"
			"	            + gl_TessCoord.y * gl_in[1].gl_Position\n"
			"	            + gl_TessCoord.y * gl_in[2].gl_Position\n"
			"	            + gl_TessCoord.z * gl_in[3].gl_Position;\n"
			"}\n";
}